

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

Box2i __thiscall
Imf_2_5::DeepTiledOutputFile::dataWindowForLevel(DeepTiledOutputFile *this,int lx,int ly)

{
  undefined8 in_RSI;
  Vec2<int> in_RDI;
  Box2i BVar1;
  stringstream _iex_replace_s;
  BaseExc *e;
  TileDescription *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  
  BVar1 = Imf_2_5::dataWindowForLevel
                    (in_stack_fffffffffffffe48,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_RDI.y,
                     in_RDI.x,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
  BVar1.min = in_RDI;
  return BVar1;
}

Assistant:

Box2i
DeepTiledOutputFile::dataWindowForLevel (int lx, int ly) const
{
    try
    {
        return OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForLevel (
                _data->tileDesc,
                _data->minX, _data->maxX,
                _data->minY, _data->maxY,
                lx, ly);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error calling dataWindowForLevel() on image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}